

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O2

string * __thiscall
cmCPackArchiveGenerator::GetArchiveComponentFileName
          (string *__return_storage_ptr__,cmCPackArchiveGenerator *this,string *component,
          bool isGroupName)

{
  bool bVar1;
  string *psVar2;
  string componentUpper;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  cmsys::SystemTools::UpperCase(&local_48,component);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::operator+(&local_68,"CPACK_ARCHIVE_",&local_48);
  std::operator+(&local_88,&local_68,"_FILE_NAME");
  bVar1 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    std::operator+(&local_68,"CPACK_ARCHIVE_",&local_48);
    std::operator+(&local_88,&local_68,"_FILE_NAME");
    cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_88);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"CPACK_ARCHIVE_FILE_NAME",(allocator<char> *)&local_68);
    bVar1 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"CPACK_ARCHIVE_FILE_NAME",&local_89);
      psVar2 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_68);
      if (psVar2 == (string *)0x0) {
        psVar2 = &cmValue::Empty_abi_cxx11_;
      }
      (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[8])
                (&local_88,this,psVar2,component,(ulong)isGroupName);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"CPACK_PACKAGE_FILE_NAME",&local_89);
      psVar2 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_68);
      if (psVar2 == (string *)0x0) {
        psVar2 = &cmValue::Empty_abi_cxx11_;
      }
      (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[8])
                (&local_88,this,psVar2,component,(ulong)isGroupName);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])(this);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackArchiveGenerator::GetArchiveComponentFileName(
  const std::string& component, bool isGroupName)
{
  std::string componentUpper(cmSystemTools::UpperCase(component));
  std::string packageFileName;

  if (this->IsSet("CPACK_ARCHIVE_" + componentUpper + "_FILE_NAME")) {
    packageFileName +=
      *this->GetOption("CPACK_ARCHIVE_" + componentUpper + "_FILE_NAME");
  } else if (this->IsSet("CPACK_ARCHIVE_FILE_NAME")) {
    packageFileName += this->GetComponentPackageFileName(
      this->GetOption("CPACK_ARCHIVE_FILE_NAME"), component, isGroupName);
  } else {
    packageFileName += this->GetComponentPackageFileName(
      this->GetOption("CPACK_PACKAGE_FILE_NAME"), component, isGroupName);
  }

  packageFileName += this->GetOutputExtension();

  return packageFileName;
}